

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_stats.cpp
# Opt level: O3

string * __thiscall
duckdb::StringStats::Max_abi_cxx11_
          (string *__return_storage_ptr__,StringStats *this,BaseStatistics *stats)

{
  long lVar1;
  StringStats *pSVar2;
  
  pSVar2 = this + 0x30;
  lVar1 = 0;
  do {
    if (pSVar2[lVar1] == (StringStats)0x0) goto LAB_0176dd7e;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 8);
  lVar1 = 8;
LAB_0176dd7e:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pSVar2,pSVar2 + lVar1);
  return __return_storage_ptr__;
}

Assistant:

string StringStats::Max(const BaseStatistics &stats) {
	return GetStringMinMaxValue(StringStats::GetDataUnsafe(stats).max);
}